

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::Version::AddIterators
          (Version *this,ReadOptions *options,
          vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *iters)

{
  pointer *pppIVar1;
  iterator iVar2;
  Iterator *in_RAX;
  pointer ppFVar3;
  int level;
  ulong uVar4;
  long lVar5;
  Iterator *local_38;
  
  ppFVar3 = this->files_[0].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = in_RAX;
  if (this->files_[0].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar3) {
    uVar4 = 0;
    do {
      local_38 = TableCache::NewIterator
                           (this->vset_->table_cache_,options,ppFVar3[uVar4]->number,
                            ppFVar3[uVar4]->file_size,(Table **)0x0);
      iVar2._M_current =
           (iters->super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (iters->super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
        _M_realloc_insert<leveldb::Iterator*>
                  ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)iters,iVar2,
                   &local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppIVar1 = &(iters->
                    super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
      uVar4 = uVar4 + 1;
      ppFVar3 = this->files_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)this->files_[0].
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3))
    ;
  }
  level = 1;
  lVar5 = 0x40;
  do {
    if (*(long *)((long)this->files_ + lVar5 + -0x28) !=
        *(long *)((long)this->files_ + lVar5 + -0x20)) {
      local_38 = NewConcatenatingIterator(this,options,level);
      iVar2._M_current =
           (iters->super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (iters->super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
        _M_realloc_insert<leveldb::Iterator*>
                  ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)iters,iVar2,
                   &local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppIVar1 = &(iters->
                    super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
    }
    level = level + 1;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xd0);
  return;
}

Assistant:

void Version::AddIterators(const ReadOptions& options,
                           std::vector<Iterator*>* iters) {
  // Merge all level zero files together since they may overlap
  for (size_t i = 0; i < files_[0].size(); i++) {
    iters->push_back(vset_->table_cache_->NewIterator(
        options, files_[0][i]->number, files_[0][i]->file_size));
  }

  // For levels > 0, we can use a concatenating iterator that sequentially
  // walks through the non-overlapping files in the level, opening them
  // lazily.
  for (int level = 1; level < config::kNumLevels; level++) {
    if (!files_[level].empty()) {
      iters->push_back(NewConcatenatingIterator(options, level));
    }
  }
}